

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall
lest::to_string<__lest_function__1822(lest::env&)::my_error>(lest *this,my_error *item)

{
  lest local_38 [32];
  my_error *local_18;
  my_error *item_local;
  
  local_18 = item;
  item_local = (my_error *)this;
  make_string<__lest_function__1822(lest::env&)::my_error>(local_38,item);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}